

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O2

bool __thiscall Omega_h::InputScalar::as(InputScalar *this,int *out)

{
  uint *puVar1;
  bool bVar2;
  LL val;
  istringstream ss;
  uint auStack_178 [90];
  
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&this->str,_S_in);
  puVar1 = (uint *)((long)auStack_178 + *(long *)(_ss + -0x18));
  *puVar1 = *puVar1 & 0xffffefff;
  std::istream::_M_extract<long_long>((longlong *)&ss);
  if (((*(uint *)((long)auStack_178 + *(long *)(_ss + -0x18) + 8) & 7) == 2) && ((int)val == val)) {
    *out = (int)val;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
  return bVar2;
}

Assistant:

bool InputScalar::as(int& out) const {
  std::istringstream ss(str);
  using LL = long long;
  LL val;
  ss >> std::noskipws >> val;
  if (ss.eof() && !ss.fail() && (val >= LL(std::numeric_limits<int>::min())) &&
      (val <= LL(std::numeric_limits<int>::max()))) {
    out = int(val);
    return true;
  }
  return false;
}